

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_error.cpp
# Opt level: O0

void skiwi::throw_error(error_type t,string *extra)

{
  error_type t_00;
  string local_70;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *extra_local;
  error_type t_local;
  
  local_18 = extra;
  extra_local._4_4_ = t;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  t_00 = extra_local._4_4_;
  std::__cxx11::string::string((string *)&local_70,(string *)extra);
  throw_error(-1,-1,&local_38,t_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void throw_error(error_type t, std::string extra)
  {
  throw_error(-1, -1, "", t, extra);
  }